

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_ref_filtering
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  bool bVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  undefined1 auVar43 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM5 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  long lVar53;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar69 [16];
  UWORD8 au1_flt [257];
  byte local_138 [264];
  
  uVar40 = nt * 4;
  iVar4 = 0;
  if (nt != 0) {
    for (; ((uint)nt >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
    }
  }
  uVar41 = 1 << ((char)iVar4 - 2U & 0x1f);
  if (nt == 0) {
    uVar41 = 0;
  }
  if ((uVar41 & "\x0e"[mode]) == 0) {
    if (-1 < nt && pu1_src != pu1_dst) {
      uVar32 = 0;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      do {
        pu1_dst[uVar32] = pu1_src[uVar32];
        uVar32 = uVar32 + 1;
      } while ((uVar40 | 1) != uVar32);
    }
  }
  else {
    bVar31 = true;
    if (nt == 0x20 && strong_intra_smoothing_enable_flag == 1) {
      uVar34 = (uint)pu1_src[uVar40] + (uint)pu1_src[0x40] + (uint)pu1_src[0x60] * -2;
      uVar41 = -uVar34;
      if (0 < (int)uVar34) {
        uVar41 = uVar34;
      }
      uVar39 = (uint)*pu1_src + (uint)pu1_src[0x40] + (uint)pu1_src[0x20] * -2;
      uVar34 = -uVar39;
      if (0 < (int)uVar39) {
        uVar34 = uVar39;
      }
      bVar31 = 7 < uVar34 || 7 < uVar41;
    }
    bVar1 = *pu1_src;
    bVar2 = pu1_src[(int)uVar40];
    local_138[0] = bVar1;
    local_138[(int)uVar40] = bVar2;
    if (bVar31) {
      if (0 < nt) {
        uVar32 = 1;
        if (1 < (int)(uVar40 - 1)) {
          uVar32 = (ulong)(uVar40 - 1);
        }
        uVar35 = 0;
        do {
          local_138[uVar35 + 1] =
               (byte)((uint)pu1_src[uVar35] + (uint)pu1_src[uVar35 + 1] * 2 +
                      (uint)pu1_src[uVar35 + 2] + 2 >> 2);
          uVar35 = uVar35 + 1;
        } while (uVar32 != uVar35);
      }
    }
    else {
      lVar33 = (long)nt;
      uVar32 = lVar33 * 2;
      bVar3 = pu1_src[lVar33 * 2];
      uVar41 = (uint)bVar3;
      local_138[lVar33 * 2] = bVar3;
      iVar4 = (int)uVar32;
      if (0 < nt) {
        uVar35 = 2;
        if (2 < iVar4) {
          uVar35 = uVar32 & 0xffffffff;
        }
        lVar33 = uVar35 - 2;
        uVar34 = (uint)bVar1;
        uVar38 = (uint)bVar3;
        uVar39 = (uint)bVar1;
        uVar36 = (uint)bVar1;
        auVar44._8_4_ = (int)lVar33;
        auVar44._0_8_ = lVar33;
        auVar44._12_4_ = (int)((ulong)lVar33 >> 0x20);
        in_XMM1 = pmovsxbq(in_XMM1,0xf0e);
        in_XMM2 = pmovsxbq(in_XMM2,0xd0c);
        in_XMM3 = pmovsxbq(in_XMM3,0xb0a);
        in_XMM4 = pmovsxbq(in_XMM4,0x908);
        in_XMM5 = pmovsxbq(in_XMM5,0x706);
        in_XMM6 = pmovsxbq(in_XMM6,0x504);
        in_XMM7 = pmovsxbq(in_XMM7,0x302);
        in_XMM8 = pmovsxbq(in_XMM8,0x100);
        iVar42 = 0;
        uVar37 = 0;
        do {
          auVar45._8_4_ = (int)uVar37;
          auVar45._0_8_ = uVar37;
          auVar45._12_4_ = (int)(uVar37 >> 0x20);
          auVar51 = auVar44 ^ _DAT_00170240;
          auVar54 = (auVar45 | in_XMM8) ^ _DAT_00170240;
          lVar33 = auVar51._0_8_;
          auVar55._0_8_ = -(ulong)(lVar33 < auVar54._0_8_);
          lVar53 = auVar51._8_8_;
          auVar55._8_8_ = -(ulong)(lVar53 < auVar54._8_8_);
          auVar69 = pshuflw(in_XMM14,auVar55,0xe8);
          auVar54._8_4_ = 0xffffffff;
          auVar54._0_8_ = 0xffffffffffffffff;
          auVar54._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar69 ^ auVar54,auVar69 ^ auVar54);
          if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_138[uVar37 + 1] = (byte)((iVar4 + -1) * uVar36 + 0x20 + uVar41 + iVar42 >> 6);
          }
          auVar55 = packssdw(auVar55,auVar55);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar69,auVar55 ^ auVar69);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            local_138[uVar37 + 2] = (byte)((iVar4 + -2) * uVar36 + 0x20 + uVar41 * 2 + iVar42 >> 6);
          }
          auVar55 = (auVar45 | in_XMM7) ^ _DAT_00170240;
          auVar47._0_8_ = -(ulong)(lVar33 < auVar55._0_8_);
          auVar47._8_8_ = -(ulong)(lVar53 < auVar55._8_8_);
          auVar54 = packssdw(auVar54,auVar47);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar46,auVar54 ^ auVar46);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 3] = (byte)(uVar41 * 3 + (iVar4 + -3) * uVar36 + 0x20 + iVar42 >> 6);
          }
          auVar55 = pshufhw(auVar47,auVar47,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar52,auVar55 ^ auVar52);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 4] = (byte)((iVar4 + -4) * uVar36 + 0x20 + uVar41 * 4 + iVar42 >> 6);
          }
          auVar55 = (auVar45 | in_XMM6) ^ _DAT_00170240;
          auVar62._0_8_ = -(ulong)(lVar33 < auVar55._0_8_);
          auVar62._8_8_ = -(ulong)(lVar53 < auVar55._8_8_);
          auVar54 = pshuflw(auVar54,auVar62,0xe8);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar60,auVar54 ^ auVar60);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 5] = (byte)((iVar4 + -5) * uVar39 + uVar41 * 5 + 0x20 + iVar42 >> 6);
          }
          auVar55 = packssdw(auVar62,auVar62);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar5,auVar55 ^ auVar5);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 6] = (byte)((iVar4 + -6) * uVar39 + uVar41 * 6 + 0x20 + iVar42 >> 6);
          }
          auVar55 = (auVar45 | in_XMM5) ^ _DAT_00170240;
          auVar56._0_8_ = -(ulong)(lVar33 < auVar55._0_8_);
          auVar56._8_8_ = -(ulong)(lVar53 < auVar55._8_8_);
          auVar54 = packssdw(auVar54,auVar56);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar6,auVar54 ^ auVar6);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 7] =
                 (byte)((uVar41 * 8 - uVar38) + (iVar4 + -7) * uVar39 + 0x20 + iVar42 >> 6);
          }
          auVar55 = pshufhw(auVar56,auVar56,0x84);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar7,auVar55 ^ auVar7);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 8] = (byte)((iVar4 + -8) * uVar36 + uVar41 * 8 + 0x20 + iVar42 >> 6);
          }
          auVar55 = (auVar45 | in_XMM4) ^ _DAT_00170240;
          auVar57._0_8_ = -(ulong)(lVar33 < auVar55._0_8_);
          auVar57._8_8_ = -(ulong)(lVar53 < auVar55._8_8_);
          auVar54 = pshuflw(auVar54,auVar57,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar8,auVar54 ^ auVar8);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_138[uVar37 + 9] = (byte)((iVar4 + -9) * uVar39 + uVar41 * 9 + 0x20 + iVar42 >> 6);
          }
          auVar55 = packssdw(auVar57,auVar57);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar9,auVar55 ^ auVar9);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            local_138[uVar37 + 10] =
                 (byte)((iVar4 + -10) * uVar39 + uVar41 * 10 + 0x20 + iVar42 >> 6);
          }
          auVar55 = (auVar45 | in_XMM3) ^ _DAT_00170240;
          auVar58._0_8_ = -(ulong)(lVar33 < auVar55._0_8_);
          auVar58._8_8_ = -(ulong)(lVar53 < auVar55._8_8_);
          auVar54 = packssdw(auVar54,auVar58);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar10,auVar54 ^ auVar10);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 0xb] =
                 (byte)((iVar4 + -0xb) * uVar39 + uVar41 * 0xb + 0x20 + iVar42 >> 6);
          }
          auVar55 = pshufhw(auVar58,auVar58,0x84);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar11,auVar55 ^ auVar11);
          auVar55 = packsswb(auVar55,auVar55);
          if ((auVar55 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 0xc] =
                 (byte)((iVar4 + -0xc) * uVar39 + uVar41 * 0xc + 0x20 + iVar42 >> 6);
          }
          auVar55 = (auVar45 | in_XMM2) ^ _DAT_00170240;
          auVar59._0_8_ = -(ulong)(lVar33 < auVar55._0_8_);
          auVar59._8_8_ = -(ulong)(lVar53 < auVar55._8_8_);
          auVar54 = pshuflw(auVar54,auVar59,0xe8);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar12,auVar54 ^ auVar12);
          in_XMM14 = packsswb(auVar54,auVar54);
          if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 0xd] =
                 (byte)((iVar4 + -0xd) * uVar39 + uVar41 * 0xd + 0x20 + iVar42 >> 6);
          }
          auVar54 = packssdw(auVar59,auVar59);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar13,auVar54 ^ auVar13);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 0xe] =
                 (byte)((iVar4 + -0xe) * uVar34 + uVar38 * 0xe + 0x20 + iVar42 >> 6);
          }
          auVar54 = (auVar45 | in_XMM1) ^ _DAT_00170240;
          auVar48._0_8_ = -(ulong)(lVar33 < auVar54._0_8_);
          auVar48._8_8_ = -(ulong)(lVar53 < auVar54._8_8_);
          auVar54 = packssdw(auVar51,auVar48);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar51,auVar54 ^ auVar51);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 0xf] =
                 (byte)((iVar4 + -0xf) * uVar34 + uVar41 * 0xf + 0x20 + iVar42 >> 6);
          }
          auVar54 = pshufhw(auVar48,auVar48,0x84);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar14,auVar54 ^ auVar14);
          auVar54 = packsswb(auVar54,auVar54);
          if ((auVar54 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            local_138[uVar37 + 0x10] =
                 (byte)((iVar4 + -0x10) * uVar34 + uVar38 * 0x10 + 0x20 + iVar42 >> 6);
          }
          uVar37 = uVar37 + 0x10;
          iVar42 = iVar42 + uVar38 * 0x10 + uVar34 * -0x10;
        } while (((int)uVar35 + 0xeU & 0xfffffff0) != uVar37);
      }
      if (0 < nt) {
        uVar35 = uVar32 & 0xffffffff;
        uVar37 = 2;
        if (2 < iVar4) {
          uVar37 = uVar32 & 0xffffffff;
        }
        lVar33 = uVar37 - 2;
        uVar39 = (uint)bVar2;
        uVar34 = (uint)bVar2;
        auVar43._8_4_ = (int)lVar33;
        auVar43._0_8_ = lVar33;
        auVar43._12_4_ = (int)((ulong)lVar33 >> 0x20);
        auVar44 = pmovsxbq(in_XMM1,0xf0e);
        auVar54 = pmovsxbq(in_XMM2,0xd0c);
        auVar45 = pmovsxbq(in_XMM3,0xb0a);
        auVar51 = pmovsxbq(in_XMM4,0x908);
        auVar55 = pmovsxbq(in_XMM5,0x706);
        auVar69 = pmovsxbq(in_XMM6,0x504);
        auVar46 = pmovsxbq(in_XMM7,0x302);
        auVar47 = pmovsxbq(in_XMM8,0x100);
        iVar42 = 0;
        uVar32 = 0;
        do {
          auVar49._8_4_ = (int)uVar32;
          auVar49._0_8_ = uVar32;
          auVar49._12_4_ = (int)(uVar32 >> 0x20);
          auVar52 = auVar43 ^ _DAT_00170240;
          auVar60 = (auVar49 | auVar47) ^ _DAT_00170240;
          lVar33 = auVar52._0_8_;
          auVar61._0_8_ = -(ulong)(lVar33 < auVar60._0_8_);
          lVar53 = auVar52._8_8_;
          auVar61._8_8_ = -(ulong)(lVar53 < auVar60._8_8_);
          auVar60 = pshuflw(in_XMM14,auVar61,0xe8);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar15,auVar60 ^ auVar15);
          if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 1] =
                 (byte)((iVar4 + -1) * uVar41 + uVar39 + 0x20 + iVar42 >> 6);
          }
          auVar62 = packssdw(auVar61,auVar61);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar16,auVar62 ^ auVar16);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 2] =
                 (byte)((iVar4 + -2) * uVar41 + 0x20 + uVar34 * 2 + iVar42 >> 6);
          }
          auVar62 = (auVar49 | auVar46) ^ _DAT_00170240;
          auVar63._0_8_ = -(ulong)(lVar33 < auVar62._0_8_);
          auVar63._8_8_ = -(ulong)(lVar53 < auVar62._8_8_);
          auVar60 = packssdw(auVar60,auVar63);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar17,auVar60 ^ auVar17);
          auVar60 = packsswb(auVar60,auVar60);
          if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 3] =
                 (byte)((iVar4 + -3) * uVar41 + uVar39 * 3 + 0x20 + iVar42 >> 6);
          }
          auVar62 = pshufhw(auVar63,auVar63,0x84);
          auVar18._8_4_ = 0xffffffff;
          auVar18._0_8_ = 0xffffffffffffffff;
          auVar18._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar18,auVar62 ^ auVar18);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 4] =
                 (byte)((iVar4 + -4) * uVar41 + 0x20 + uVar34 * 4 + iVar42 >> 6);
          }
          auVar62 = (auVar49 | auVar69) ^ _DAT_00170240;
          auVar64._0_8_ = -(ulong)(lVar33 < auVar62._0_8_);
          auVar64._8_8_ = -(ulong)(lVar53 < auVar62._8_8_);
          auVar60 = pshuflw(auVar60,auVar64,0xe8);
          auVar19._8_4_ = 0xffffffff;
          auVar19._0_8_ = 0xffffffffffffffff;
          auVar19._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar19,auVar60 ^ auVar19);
          auVar60 = packsswb(auVar60,auVar60);
          if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 5] =
                 (byte)((iVar4 + -5) * uVar41 + uVar39 * 5 + 0x20 + iVar42 >> 6);
          }
          auVar62 = packssdw(auVar64,auVar64);
          auVar20._8_4_ = 0xffffffff;
          auVar20._0_8_ = 0xffffffffffffffff;
          auVar20._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar20,auVar62 ^ auVar20);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 6] =
                 (byte)((iVar4 + -6) * uVar41 + uVar39 * 6 + 0x20 + iVar42 >> 6);
          }
          auVar62 = (auVar49 | auVar55) ^ _DAT_00170240;
          auVar65._0_8_ = -(ulong)(lVar33 < auVar62._0_8_);
          auVar65._8_8_ = -(ulong)(lVar53 < auVar62._8_8_);
          auVar60 = packssdw(auVar60,auVar65);
          auVar21._8_4_ = 0xffffffff;
          auVar21._0_8_ = 0xffffffffffffffff;
          auVar21._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar21,auVar60 ^ auVar21);
          auVar60 = packsswb(auVar60,auVar60);
          if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 7] =
                 (byte)((iVar4 + -7) * uVar41 + (uVar34 * 8 - uVar39) + 0x20 + iVar42 >> 6);
          }
          auVar62 = pshufhw(auVar65,auVar65,0x84);
          auVar22._8_4_ = 0xffffffff;
          auVar22._0_8_ = 0xffffffffffffffff;
          auVar22._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar22,auVar62 ^ auVar22);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 8] =
                 (byte)((iVar4 + -8) * uVar41 + uVar34 * 8 + 0x20 + iVar42 >> 6);
          }
          auVar62 = (auVar49 | auVar51) ^ _DAT_00170240;
          auVar66._0_8_ = -(ulong)(lVar33 < auVar62._0_8_);
          auVar66._8_8_ = -(ulong)(lVar53 < auVar62._8_8_);
          auVar60 = pshuflw(auVar60,auVar66,0xe8);
          auVar23._8_4_ = 0xffffffff;
          auVar23._0_8_ = 0xffffffffffffffff;
          auVar23._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar23,auVar60 ^ auVar23);
          auVar60 = packsswb(auVar60,auVar60);
          if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 9] =
                 (byte)((iVar4 + -9) * uVar41 + uVar34 * 9 + 0x20 + iVar42 >> 6);
          }
          auVar62 = packssdw(auVar66,auVar66);
          auVar24._8_4_ = 0xffffffff;
          auVar24._0_8_ = 0xffffffffffffffff;
          auVar24._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar24,auVar62 ^ auVar24);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 10] =
                 (byte)((iVar4 + -10) * uVar41 + uVar39 * 10 + 0x20 + iVar42 >> 6);
          }
          auVar62 = (auVar49 | auVar45) ^ _DAT_00170240;
          auVar67._0_8_ = -(ulong)(lVar33 < auVar62._0_8_);
          auVar67._8_8_ = -(ulong)(lVar53 < auVar62._8_8_);
          auVar60 = packssdw(auVar60,auVar67);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar25,auVar60 ^ auVar25);
          auVar60 = packsswb(auVar60,auVar60);
          if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 0xb] =
                 (byte)((iVar4 + -0xb) * uVar41 + uVar34 + uVar39 * 10 + 0x20 + iVar42 >> 6);
          }
          auVar62 = pshufhw(auVar67,auVar67,0x84);
          auVar26._8_4_ = 0xffffffff;
          auVar26._0_8_ = 0xffffffffffffffff;
          auVar26._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar26,auVar62 ^ auVar26);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 0xc] =
                 (byte)((iVar4 + -0xc) * uVar41 + uVar39 * 0xc + 0x20 + iVar42 >> 6);
          }
          auVar62 = (auVar49 | auVar54) ^ _DAT_00170240;
          auVar68._0_8_ = -(ulong)(lVar33 < auVar62._0_8_);
          auVar68._8_8_ = -(ulong)(lVar53 < auVar62._8_8_);
          auVar60 = pshuflw(auVar60,auVar68,0xe8);
          auVar27._8_4_ = 0xffffffff;
          auVar27._0_8_ = 0xffffffffffffffff;
          auVar27._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar27,auVar60 ^ auVar27);
          in_XMM14 = packsswb(auVar60,auVar60);
          if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 0xd] =
                 (byte)((iVar4 + -0xd) * uVar41 + uVar39 * 0xd + 0x20 + iVar42 >> 6);
          }
          auVar60 = packssdw(auVar68,auVar68);
          auVar28._8_4_ = 0xffffffff;
          auVar28._0_8_ = 0xffffffffffffffff;
          auVar28._12_4_ = 0xffffffff;
          auVar60 = packssdw(auVar60 ^ auVar28,auVar60 ^ auVar28);
          auVar60 = packsswb(auVar60,auVar60);
          if ((auVar60 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 0xe] =
                 (byte)(uVar39 * 0xe + (iVar4 + -0xe) * uVar41 + 0x20 + iVar42 >> 6);
          }
          auVar60 = (auVar49 | auVar44) ^ _DAT_00170240;
          auVar50._0_8_ = -(ulong)(lVar33 < auVar60._0_8_);
          auVar50._8_8_ = -(ulong)(lVar53 < auVar60._8_8_);
          auVar52 = packssdw(auVar52,auVar50);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar29,auVar52 ^ auVar29);
          auVar52 = packsswb(auVar52,auVar52);
          if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 0xf] =
                 (byte)((iVar4 + -0xf) * uVar41 + uVar39 * 0xf + 0x20 + iVar42 >> 6);
          }
          auVar52 = pshufhw(auVar50,auVar50,0x84);
          auVar30._8_4_ = 0xffffffff;
          auVar30._0_8_ = 0xffffffffffffffff;
          auVar30._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar30,auVar52 ^ auVar30);
          auVar52 = packsswb(auVar52,auVar52);
          if ((auVar52 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            local_138[uVar32 + uVar35 + 0x10] =
                 (byte)((iVar4 + -0x10) * uVar41 + uVar39 * 0x10 + 0x20 + iVar42 >> 6);
          }
          uVar32 = uVar32 + 0x10;
          iVar42 = iVar42 + uVar39 * 0x10 + uVar41 * -0x10;
        } while (((int)uVar37 + 0xeU & 0xfffffff0) != uVar32);
      }
    }
    if (-1 < nt) {
      uVar41 = 0;
      if (0 < (int)uVar40) {
        uVar41 = uVar40;
      }
      memcpy(pu1_dst,local_138,(ulong)(uVar41 | 1));
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering(UWORD8 *pu1_src,
                                    WORD32 nt,
                                    UWORD8 *pu1_dst,
                                    WORD32 mode,
                                    WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    /*WORD32 dc_val = 1 << (BIT_DEPTH - 5);*/
    WORD32 dc_val = 1 << (8 - 5);
    //WORD32 strong_intra_smoothing_enable_flag  = 1;

    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            for(i = 0; i < (four_nt + 1); i++)
                pu1_dst[i] = pu1_src[i];
        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (ABS(pu1_src[2 * nt] + pu1_src[4 * nt]
                            - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (ABS(pu1_src[2 * nt] + pu1_src[0]
                            - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;

        }
        else
        {
            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt - 1); i++)
            {
                au1_flt[i + 1] = (pu1_src[i] + 2 * pu1_src[i + 1]
                                + pu1_src[i + 2] + 2) >> 2;
            }
        }


        for(i = 0; i < (four_nt + 1); i++)
            pu1_dst[i] = au1_flt[i];
    }

}